

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall
Rml::Element::Animate
          (Element *this,String *property_name,Property *target_value,float duration,Tween tween,
          int num_iterations,bool alternate_direction,float delay,Property *start_value)

{
  bool bVar1;
  pointer this_00;
  const_iterator local_70;
  undefined8 local_68;
  CallbackFnc local_60;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_58;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_50;
  iterator it_animation;
  PropertyId property_id;
  bool result;
  float delay_local;
  bool alternate_direction_local;
  int num_iterations_local;
  float duration_local;
  Property *target_value_local;
  String *property_name_local;
  Element *this_local;
  Tween tween_local;
  
  it_animation._M_current._7_1_ = 0;
  it_animation._M_current._6_1_ = StyleSheetSpecification::GetPropertyId(property_name);
  local_50._M_current =
       (ElementAnimation *)
       StartAnimation(this,it_animation._M_current._6_1_,start_value,num_iterations,
                      alternate_direction,delay,false);
  local_58._M_current =
       (ElementAnimation *)
       ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                 (&this->animations);
  bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
              ::operator->(&local_50);
    local_68 = tween._0_8_;
    local_60 = tween.callback;
    it_animation._M_current._7_1_ =
         ElementAnimation::AddKey(this_00,duration,target_value,this,tween,true);
    if (!(bool)it_animation._M_current._7_1_) {
      __gnu_cxx::
      __normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
      ::__normal_iterator<Rml::ElementAnimation*>
                ((__normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
                  *)&local_70,&local_50);
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::erase
                (&this->animations,local_70);
    }
  }
  return (bool)(it_animation._M_current._7_1_ & 1);
}

Assistant:

bool Element::Animate(const String& property_name, const Property& target_value, float duration, Tween tween, int num_iterations,
	bool alternate_direction, float delay, const Property* start_value)
{
	bool result = false;
	PropertyId property_id = StyleSheetSpecification::GetPropertyId(property_name);

	auto it_animation = StartAnimation(property_id, start_value, num_iterations, alternate_direction, delay, false);
	if (it_animation != animations.end())
	{
		result = it_animation->AddKey(duration, target_value, *this, tween, true);
		if (!result)
			animations.erase(it_animation);
	}

	return result;
}